

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O2

void __thiscall chrono::ChBody::SetInertiaXY(ChBody *this,ChVector<double> *iner)

{
  Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_8;
  
  local_8.m_xpr = &(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>;
  *(double *)
   ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 8) =
       iner->m_data[0];
  *(double *)
   ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x10
   ) = iner->m_data[1];
  *(double *)
   ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x28
   ) = iner->m_data[2];
  *(double *)
   ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x18
   ) = iner->m_data[0];
  *(double *)
   ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x30
   ) = iner->m_data[1];
  *(double *)
   ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x38
   ) = iner->m_data[2];
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>>
            (&(this->variables).inv_inertia.super_Matrix<double,_3,_3,_1,_3,_3>,&local_8);
  return;
}

Assistant:

void ChBody::SetInertiaXY(const ChVector<>& iner) {
    variables.GetBodyInertia()(0, 1) = iner.x();
    variables.GetBodyInertia()(0, 2) = iner.y();
    variables.GetBodyInertia()(1, 2) = iner.z();
    variables.GetBodyInertia()(1, 0) = iner.x();
    variables.GetBodyInertia()(2, 0) = iner.y();
    variables.GetBodyInertia()(2, 1) = iner.z();
    variables.GetBodyInvInertia() = variables.GetBodyInertia().inverse();
}